

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O0

void od_ec_encode_cdf_q15(od_ec_enc *enc,int s,uint16_t *icdf,int nsyms)

{
  int in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  od_ec_encode_q15((od_ec_enc *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                   (uint)((ulong)in_RDX >> 0x20),(uint)in_RDX,in_ECX,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void od_ec_encode_cdf_q15(od_ec_enc *enc, int s, const uint16_t *icdf,
                          int nsyms) {
  (void)nsyms;
  assert(s >= 0);
  assert(s < nsyms);
  assert(icdf[nsyms - 1] == OD_ICDF(CDF_PROB_TOP));
  od_ec_encode_q15(enc, s > 0 ? icdf[s - 1] : OD_ICDF(0), icdf[s], s, nsyms);
}